

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

bool __thiscall
cfd::TransactionContext::VerifyInputSignature
          (TransactionContext *this,ByteData *signature,Pubkey *pubkey,OutPoint *outpoint,
          SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  undefined1 uVar1;
  ByteData sighash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  SigHashType local_3c [12];
  
  cfd::core::SigHashType::SigHashType(local_3c,sighash_type);
  (**(code **)(*(long *)this + 0x98))(&local_58,this,outpoint,pubkey,local_3c,value,version);
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_70,(vector *)&local_88);
  uVar1 = cfd::core::SignatureUtil::VerifyEcSignature((ByteData256 *)&local_70,pubkey,signature);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return (bool)uVar1;
}

Assistant:

bool TransactionContext::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const OutPoint& outpoint,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  auto sighash =
      CreateSignatureHash(outpoint, pubkey, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}